

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rs_generator.cc
# Opt level: O0

string * __thiscall
t_rs_generator::string_container_write_variable
          (string *__return_storage_ptr__,t_rs_generator *this,t_type *ttype,string *base_var)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  undefined1 local_2b;
  byte local_2a;
  byte local_29;
  bool type_is_double;
  string *psStack_28;
  bool type_needs_deref;
  string *base_var_local;
  t_type *ttype_local;
  t_rs_generator *this_local;
  string *write_variable;
  
  psStack_28 = base_var;
  base_var_local = (string *)ttype;
  ttype_local = (t_type *)this;
  this_local = (t_rs_generator *)__return_storage_ptr__;
  local_29 = needs_deref_on_container_write(this,ttype);
  local_2a = is_double(this,(t_type *)base_var_local);
  local_2b = 0;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  if (((local_2a & 1) == 0) || ((local_29 & 1) == 0)) {
    if ((local_29 & 1) == 0) {
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)psStack_28);
    }
    else {
      std::operator+(&local_a0,"*",psStack_28);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
    }
  }
  else {
    std::operator+(&local_70,"(*",psStack_28);
    std::operator+(&local_50,&local_70,")");
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
  }
  return __return_storage_ptr__;
}

Assistant:

string t_rs_generator::string_container_write_variable(t_type* ttype, const string& base_var) {
  bool type_needs_deref = needs_deref_on_container_write(ttype);
  bool type_is_double = is_double(ttype);

  string write_variable;

  if (type_is_double && type_needs_deref) {
    write_variable = "(*" + base_var + ")";
  } else if (type_needs_deref) {
    write_variable = "*" + base_var;
  } else {
    write_variable = base_var;
  }

  return write_variable;
}